

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

curl_hash_element * Curl_hash_next_element(curl_hash_iterator *iter)

{
  curl_hash *pcVar1;
  curl_hash_element *he;
  int i;
  curl_hash *h;
  curl_hash_iterator *iter_local;
  
  pcVar1 = iter->hash;
  if (iter->current_element != (curl_llist_element *)0x0) {
    iter->current_element = iter->current_element->next;
  }
  if (iter->current_element == (curl_llist_element *)0x0) {
    for (he._4_4_ = iter->slot_index; he._4_4_ < pcVar1->slots; he._4_4_ = he._4_4_ + 1) {
      if (pcVar1->table[he._4_4_].head != (curl_llist_element *)0x0) {
        iter->current_element = pcVar1->table[he._4_4_].head;
        iter->slot_index = he._4_4_ + 1;
        break;
      }
    }
  }
  if (iter->current_element == (curl_llist_element *)0x0) {
    iter->current_element = (curl_llist_element *)0x0;
    iter_local = (curl_hash_iterator *)0x0;
  }
  else {
    iter_local = (curl_hash_iterator *)iter->current_element->ptr;
  }
  return (curl_hash_element *)iter_local;
}

Assistant:

struct curl_hash_element *
Curl_hash_next_element(struct curl_hash_iterator *iter)
{
  struct curl_hash *h = iter->hash;

  /* Get the next element in the current list, if any */
  if(iter->current_element)
    iter->current_element = iter->current_element->next;

  /* If we have reached the end of the list, find the next one */
  if(!iter->current_element) {
    int i;
    for(i = iter->slot_index; i < h->slots; i++) {
      if(h->table[i].head) {
        iter->current_element = h->table[i].head;
        iter->slot_index = i + 1;
        break;
      }
    }
  }

  if(iter->current_element) {
    struct curl_hash_element *he = iter->current_element->ptr;
    return he;
  }
  iter->current_element = NULL;
  return NULL;
}